

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_stack.hpp
# Opt level: O3

void __thiscall
boost::xpressive::detail::
sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::chunk::chunk(chunk *this,size_t size,
              sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *t,size_t count,chunk *back,chunk *next)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  undefined7 uVar4;
  sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar5;
  sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar6;
  size_t sVar7;
  
  psVar5 = (sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)operator_new(size * 0x28);
  psVar6 = psVar5;
  sVar7 = size;
  if (size != 0) {
    do {
      uVar4 = *(undefined7 *)&t->field_0x21;
      psVar6->zero_width_ = t->zero_width_;
      *(undefined7 *)&psVar6->field_0x21 = uVar4;
      pcVar1 = (t->
               super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).
               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .first._M_current;
      pcVar2 = (t->
               super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).
               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .second._M_current;
      uVar4 = *(undefined7 *)
               &(t->
                super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).field_0x11;
      pcVar3 = (t->begin_)._M_current;
      (psVar6->
      super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ).matched = (t->
                  super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ).matched;
      *(undefined7 *)
       &(psVar6->
        super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ).field_0x11 = uVar4;
      (psVar6->begin_)._M_current = pcVar3;
      (psVar6->
      super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ).
      super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .first._M_current = pcVar1;
      (psVar6->
      super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ).
      super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .second._M_current = pcVar2;
      sVar7 = sVar7 - 1;
      psVar6 = psVar6 + 1;
    } while (sVar7 != 0);
  }
  this->begin_ = psVar5;
  this->curr_ = psVar5 + count;
  this->end_ = psVar5 + size;
  this->back_ = back;
  this->next_ = next;
  if (back != (chunk *)0x0) {
    back->next_ = this;
    next = this->next_;
  }
  if (next != (chunk *)0x0) {
    next->back_ = this;
  }
  return;
}

Assistant:

chunk(std::size_t size, T const &t, std::size_t count, chunk *back, chunk *next)
          : begin_(allocate(size, t))
          , curr_(begin_ + count)
          , end_(begin_ + size)
          , back_(back)
          , next_(next)
        {
            if(this->back_)
                this->back_->next_ = this;
            if(this->next_)
                this->next_->back_ = this;
        }